

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

uint8_t * libdef_uleb128(uint8_t *p,uint32_t *vv)

{
  uint32_t uVar1;
  byte bVar2;
  uint32_t *puVar3;
  uint local_1c;
  int sh;
  uint32_t v;
  uint32_t *vv_local;
  uint8_t *p_local;
  
  local_1c = (uint)*p;
  vv_local = (uint32_t *)(p + 1);
  if (0x7f < local_1c) {
    bVar2 = 0;
    local_1c = local_1c & 0x7f;
    do {
      bVar2 = bVar2 + 7;
      local_1c = ((byte)*vv_local & 0x7f) << (bVar2 & 0x1f) | local_1c;
      puVar3 = (uint32_t *)((long)vv_local + 1);
      uVar1 = *vv_local;
      vv_local = puVar3;
    } while (0x7f < (byte)uVar1);
  }
  *vv = local_1c;
  return (uint8_t *)vv_local;
}

Assistant:

static uint8_t *libdef_uleb128(uint8_t *p, uint32_t *vv)
{
  uint32_t v = *p++;
  if (v >= 0x80) {
    int sh = 0; v &= 0x7f;
    do { v |= ((*p & 0x7f) << (sh += 7)); } while (*p++ >= 0x80);
  }
  *vv = v;
  return p;
}